

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O3

StackSym * __thiscall StackSym::GetTypeEquivSym(StackSym *this,IRType type,Func *func)

{
  uint uVar1;
  SymID id;
  RegSlot byteCodeRegSlot;
  StackSym *pSVar2;
  
  pSVar2 = GetTypeEquivSym_NoCreate(this,type);
  if (pSVar2 == (StackSym *)0x0) {
    if (func == (Func *)0x0) {
      pSVar2 = (StackSym *)0x0;
    }
    else {
      uVar1 = *(uint *)&this->field_0x18;
      id = SymTable::NewID(func->m_symTable);
      if ((uVar1 >> 0xd & 1) == 0) {
        byteCodeRegSlot = 0xffffffff;
      }
      else {
        byteCodeRegSlot = GetByteCodeRegSlot(this);
        func = GetByteCodeFunc(this);
      }
      pSVar2 = New(id,type,byteCodeRegSlot,func);
      pSVar2->m_equivNext = this->m_equivNext;
      this->m_equivNext = pSVar2;
      if (type != TyVar) {
        pSVar2->field_0x1a = pSVar2->field_0x1a | 1;
      }
    }
  }
  return pSVar2;
}

Assistant:

StackSym *
StackSym::GetTypeEquivSym(IRType type, Func *func)
{
    StackSym *sym = this->GetTypeEquivSym_NoCreate(type);

    if (sym != nullptr)
    {
        return sym;
    }

    // Don't allocate if func wasn't passed in.
    if (func == nullptr)
    {
        return nullptr;
    }

    if (this->HasByteCodeRegSlot())
    {
        sym = StackSym::New(func->m_symTable->NewID(), type,
            this->GetByteCodeRegSlot(), this->GetByteCodeFunc());
    }
    else
    {
        sym = StackSym::New(type, func);
    }
    sym->m_equivNext = this->m_equivNext;
    this->m_equivNext = sym;
    if (type != TyVar)
    {
        sym->m_isTypeSpec = true;
    }

    return sym;
}